

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_resampling_backend_init__linear
                    (void *pUserData,ma_resampler_config *pConfig,void *pHeap,
                    ma_resampling_backend **ppBackend)

{
  ma_result mVar1;
  ma_linear_resampler_config local_38;
  
  local_38.lpfOrder = (pConfig->linear).lpfOrder;
  local_38.format = pConfig->format;
  local_38.channels = pConfig->channels;
  local_38.sampleRateIn = pConfig->sampleRateIn;
  local_38.sampleRateOut = pConfig->sampleRateOut;
  local_38._20_4_ = 0;
  local_38.lpfNyquistFactor = 1.0;
  mVar1 = ma_linear_resampler_init_preallocated
                    (&local_38,pHeap,(ma_linear_resampler *)((long)pUserData + 0x28));
  if (mVar1 == MA_SUCCESS) {
    *ppBackend = (ma_linear_resampler *)((long)pUserData + 0x28);
    mVar1 = MA_SUCCESS;
  }
  return mVar1;
}

Assistant:

static ma_result ma_resampling_backend_init__linear(void* pUserData, const ma_resampler_config* pConfig, void* pHeap, ma_resampling_backend** ppBackend)
{
    ma_resampler* pResampler = (ma_resampler*)pUserData;
    ma_result result;
    ma_linear_resampler_config linearConfig;

    (void)pUserData;

    linearConfig = ma_resampling_backend_get_config__linear(pConfig);

    result = ma_linear_resampler_init_preallocated(&linearConfig, pHeap, &pResampler->state.linear);
    if (result != MA_SUCCESS) {
        return result;
    }

    *ppBackend = &pResampler->state.linear;

    return MA_SUCCESS;
}